

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

aiVectorKey * __thiscall
comparer_context::cmp<aiVectorKey>
          (aiVectorKey *__return_storage_ptr__,comparer_context *this,string *name)

{
  double dVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  aiVector3D aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [16];
  
  std::operator+(&local_58,name,".mTime");
  dVar1 = cmp<double>(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_58,name,".mValue");
  aVar2 = cmp<aiVector3t<float>>(this,&local_58);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = aVar2._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  std::__cxx11::string::~string((string *)&local_58);
  __return_storage_ptr__->mTime = dVar1;
  (__return_storage_ptr__->mValue).x = (float)local_38._0_4_;
  (__return_storage_ptr__->mValue).y = (float)local_38._4_4_;
  (__return_storage_ptr__->mValue).z = aVar2.z;
  return __return_storage_ptr__;
}

Assistant:

aiVectorKey comparer_context :: cmp<aiVectorKey >(const std::string& name)
{
    const double mTime = cmp<double>(name+".mTime");
    const aiVector3D mValue = cmp<aiVector3D>(name+".mValue");

    return aiVectorKey(mTime,mValue);
}